

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O0

TldAsKey * __thiscall
BinHash<TldAsKey>::DoInsert(BinHash<TldAsKey> *this,TldAsKey *key,bool need_alloc,bool *stored)

{
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  byte local_49;
  TldAsKey *local_40;
  TldAsKey *oldKey;
  TldAsKey *pTStack_30;
  uint32_t hash_index;
  TldAsKey *retKey;
  bool *stored_local;
  bool need_alloc_local;
  TldAsKey *key_local;
  BinHash<TldAsKey> *this_local;
  
  pTStack_30 = (TldAsKey *)0x0;
  *stored = false;
  if ((key != (TldAsKey *)0x0) && (this->tableSize != 0)) {
    uVar2 = TldAsKey::Hash(key);
    uVar3 = uVar2 % this->tableSize;
    local_40 = this->hashBin[uVar3];
    while( true ) {
      local_49 = 0;
      if (local_40 != (TldAsKey *)0x0) {
        bVar1 = TldAsKey::IsSameKey(key,local_40);
        local_49 = bVar1 ^ 0xff;
      }
      if ((local_49 & 1) == 0) break;
      local_40 = local_40->HashNext;
    }
    if (local_40 == (TldAsKey *)0x0) {
      pTStack_30 = key;
      if (need_alloc) {
        pTStack_30 = TldAsKey::CreateCopy(key);
      }
      if (pTStack_30 != (TldAsKey *)0x0) {
        pTStack_30->HashNext = this->hashBin[uVar3];
        this->hashBin[uVar3] = pTStack_30;
        *stored = true;
        this->tableCount = this->tableCount + 1;
      }
    }
    else {
      TldAsKey::Add(local_40,key);
      pTStack_30 = local_40;
      *stored = false;
    }
  }
  return pTStack_30;
}

Assistant:

KeyObj * DoInsert(KeyObj * key, bool need_alloc, bool * stored)
    {
        KeyObj * retKey = NULL;

        *stored = false;

        if (key != NULL && tableSize > 0)
        {
            uint32_t hash_index = key->Hash() % tableSize;
            KeyObj * oldKey = hashBin[hash_index];

            while (oldKey != NULL && !key->IsSameKey(oldKey))
            {
                oldKey = oldKey->HashNext;
            }

            if (oldKey != NULL)
            {
                /* the keyed object is already in the table*/
                oldKey->Add(key);
                retKey = oldKey;
                *stored = false;
            }
            else
            {
                retKey = key;

                if (need_alloc)
                {
                    retKey = key->CreateCopy();
                }

                if (retKey != NULL)
                {
                    retKey->HashNext = hashBin[hash_index];
                    hashBin[hash_index] = retKey;
                    *stored = true;
                    tableCount++;
                }
            }
        }

        return retKey;
    }